

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this)

{
  MemberInfo **firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar1;
  MemberInfo **ppMVar2;
  MemberInfo **endCopy;
  MemberInfo **posCopy;
  MemberInfo **ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this_local;
  
  firstElement = this->ptr;
  ppMVar1 = this->pos;
  ppMVar2 = this->endPtr;
  if (firstElement != (MemberInfo **)0x0) {
    this->ptr = (MemberInfo **)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
    this->endPtr = (MemberInfo **)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>
              (this->disposer,firstElement,(long)ppMVar1 - (long)firstElement >> 3,
               (long)ppMVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }